

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O1

char * conf_get_str_str_opt(Conf *conf,int primary,char *secondary)

{
  void *pvVar1;
  char *pcVar2;
  key key;
  int local_18 [2];
  char *local_10;
  
  if (subkeytypes[primary] != 3) {
    __assert_fail("subkeytypes[primary] == TYPE_STR",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                  0x143,"char *conf_get_str_str_opt(Conf *, int, const char *)");
  }
  if (valuetypes[primary] == 3) {
    pcVar2 = (char *)0x0;
    local_18[0] = primary;
    local_10 = secondary;
    pvVar1 = find234(conf->tree,local_18,(cmpfn234)0x0);
    if (pvVar1 != (void *)0x0) {
      pcVar2 = *(char **)((long)pvVar1 + 0x10);
    }
    return pcVar2;
  }
  __assert_fail("valuetypes[primary] == TYPE_STR",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                0x144,"char *conf_get_str_str_opt(Conf *, int, const char *)");
}

Assistant:

char *conf_get_str_str_opt(Conf *conf, int primary, const char *secondary)
{
    struct key key;
    struct conf_entry *entry;

    assert(subkeytypes[primary] == TYPE_STR);
    assert(valuetypes[primary] == TYPE_STR);
    key.primary = primary;
    key.secondary.s = (char *)secondary;
    entry = find234(conf->tree, &key, NULL);
    return entry ? entry->value.u.stringval : NULL;
}